

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

void __thiscall
iDynTree::AttitudeQuaternionEKF::prepareSystemNoiseCovarianceMatrix
          (AttitudeQuaternionEKF *this,MatrixDynSize *Q)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  PointerType pdVar5;
  long lVar6;
  PointerType pdVar7;
  long lVar8;
  PointerType pdVar9;
  long lVar10;
  MatrixDynSize Fu_dyn;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> Q_;
  Matrix6x6 U_dyn;
  assign_op<double,_double> local_1f1;
  long local_1f0;
  MatrixDynSize local_1e8 [40];
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1c0;
  double local_1a0 [21];
  double adStack_f8 [15];
  undefined1 local_80 [48];
  PointerType local_50;
  variable_if_dynamic<long,__1> local_48;
  variable_if_dynamic<long,__1> local_40;
  
  uVar4 = iDynTree::MatrixDynSize::rows();
  if (uVar4 != this->m_state_size) {
    uVar4 = iDynTree::MatrixDynSize::cols();
    if (uVar4 != this->m_state_size) {
      iDynTree::MatrixDynSize::resize((ulong)Q,this->m_state_size);
      uVar4 = this->m_state_size;
    }
  }
  iDynTree::MatrixDynSize::MatrixDynSize(local_1e8,uVar4,this->m_input_size + 3);
  iDynTree::MatrixDynSize::zero();
  memset(local_1a0,0,0x120);
  pdVar5 = (PointerType)iDynTree::MatrixDynSize::data();
  local_1f0 = iDynTree::MatrixDynSize::rows();
  lVar6 = iDynTree::MatrixDynSize::cols();
  pdVar7 = (PointerType)iDynTree::MatrixDynSize::data();
  lVar8 = iDynTree::MatrixDynSize::rows();
  local_1c0.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value = iDynTree::MatrixDynSize::cols();
  pdVar9 = pdVar5 + lVar6 * 4 + 2;
  lVar10 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar10);
    dVar2 = pdVar1[1];
    pdVar9[-2] = *pdVar1;
    pdVar9[-1] = dVar2;
    *pdVar9 = *(double *)((long)(this->m_Id3).m_data + lVar10 + 0x10);
    lVar10 = lVar10 + 0x18;
    pdVar9 = pdVar9 + lVar6;
  } while (lVar10 != 0x48);
  pdVar9 = pdVar5 + lVar6 * 7 + 5;
  lVar10 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar10);
    dVar2 = pdVar1[1];
    pdVar9[-2] = *pdVar1;
    pdVar9[-1] = dVar2;
    *pdVar9 = *(double *)((long)(this->m_Id3).m_data + lVar10 + 0x10);
    lVar10 = lVar10 + 0x18;
    pdVar9 = pdVar9 + lVar6;
  } while (lVar10 != 0x48);
  dVar2 = (this->m_params_qekf).gyroscope_noise_variance;
  lVar10 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar10);
    dVar3 = pdVar1[1];
    *(double *)((long)local_1a0 + lVar10 * 2) = *pdVar1 * dVar2;
    *(double *)((long)local_1a0 + lVar10 * 2 + 8) = dVar3 * dVar2;
    *(double *)((long)local_1a0 + lVar10 * 2 + 0x10) =
         *(double *)((long)(this->m_Id3).m_data + lVar10 + 0x10) * dVar2;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  dVar2 = (this->m_params_qekf).gyro_bias_noise_variance;
  lVar10 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar10);
    dVar3 = pdVar1[1];
    *(double *)((long)adStack_f8 + lVar10 * 2) = *pdVar1 * dVar2;
    *(double *)((long)adStack_f8 + lVar10 * 2 + 8) = dVar3 * dVar2;
    *(double *)((long)adStack_f8 + lVar10 * 2 + 0x10) =
         *(double *)((long)(this->m_Id3).m_data + lVar10 + 0x10) * dVar2;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  local_80._8_8_ = local_1f0;
  local_80._32_8_ = local_1a0;
  local_48.m_value = local_1f0;
  local_1c0.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = pdVar7;
  local_1c0.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value = lVar8;
  local_80._0_8_ = pdVar5;
  local_80._16_8_ = lVar6;
  local_50 = pdVar5;
  local_40.m_value = lVar6;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>,Eigen::internal::assign_op<double,double>>
            (&local_1c0,
             (Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
              *)local_80,&local_1f1,(type)0x0);
  iDynTree::MatrixDynSize::~MatrixDynSize(local_1e8);
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::prepareSystemNoiseCovarianceMatrix(iDynTree::MatrixDynSize &Q)
{
    using iDynTree::toEigen;

    if (Q.rows() != m_state_size && Q.cols() != m_state_size)
    {
        Q.resize(m_state_size, m_state_size);
    }


    iDynTree::MatrixDynSize Fu_dyn(m_state_size, m_input_size + m_state_qekf.m_gyroscope_bias.size());
    Fu_dyn.zero();
    iDynTree::Matrix6x6 U_dyn;
    U_dyn.zero();

    auto F_u(toEigen(Fu_dyn));
    auto U(toEigen(U_dyn));
    auto Id3(toEigen(m_Id3));
    auto Q_(toEigen(Q));

    F_u.block<3, 3>(4, 0) = Id3;
    F_u.block<3,3>(7, 3) = Id3;

    U.block<3, 3>(0, 0) = Id3*m_params_qekf.gyroscope_noise_variance;
    U.block<3, 3>(3, 3) = Id3*m_params_qekf.gyro_bias_noise_variance;

    Q_ = F_u*U*F_u.transpose();
}